

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generation.cpp
# Opt level: O0

void __thiscall Generation::Generation(Generation *this,string *inPath,int inUmask,bool inIsToken)

{
  Mutex *pMVar1;
  byte in_CL;
  undefined4 in_EDX;
  string *in_RSI;
  MutexFactory *in_RDI;
  CK_CREATEMUTEX *this_00;
  undefined3 in_stack_00000040;
  
  in_RDI->_vptr_MutexFactory = (_func_int **)&PTR__Generation_002238f8;
  this_00 = &in_RDI->createMutex;
  std::__cxx11::string::string((string *)this_00);
  std::__cxx11::string::operator=((string *)this_00,in_RSI);
  *(undefined4 *)&in_RDI->enabled = in_EDX;
  in_RDI->field_0x2c = in_CL & 1;
  in_RDI->field_0x2d = 0;
  in_RDI[1]._vptr_MutexFactory = (_func_int **)0x0;
  in_RDI[1].createMutex = (CK_CREATEMUTEX)0x0;
  if ((in_RDI->field_0x2c & 1) != 0) {
    MutexFactory::i();
    pMVar1 = MutexFactory::getMutex(in_RDI);
    in_RDI[1].createMutex = (CK_CREATEMUTEX)pMVar1;
    if (in_RDI[1].createMutex != (CK_CREATEMUTEX)0x0) {
      commit((Generation *)CONCAT44(inUmask,_in_stack_00000040));
    }
  }
  return;
}

Assistant:

Generation::Generation(const std::string inPath, int inUmask, bool inIsToken)
{
	path = inPath;
	umask = inUmask;
	isToken = inIsToken;
	pendingUpdate = false;
	currentValue = 0;
	genMutex = NULL;

	if (isToken)
	{
		genMutex = MutexFactory::i()->getMutex();

		if (genMutex != NULL)
		{
			commit();
		}
	}
}